

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>
* jsoncons::
  decode_traits<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>,char,void>
  ::
  decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
            (basic_staj_cursor<char> *cursor,
            json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
            *decoder,error_code *ec)

{
  error_code ec_00;
  error_code ec_01;
  bool bVar1;
  undefined8 uVar2;
  error_category *peVar3;
  ser_error *this;
  size_t column;
  long *plVar4;
  long *plVar5;
  error_code *in_RCX;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_RDX;
  long *in_RSI;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_RDI;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffff30;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  error_code *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  ser_error *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  error_category *in_stack_ffffffffffffff70;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *this_00;
  
  this_00 = in_RDI;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::reset(in_stack_ffffffffffffff30);
  (**(code **)(*in_RSI + 0x30))(in_RSI,in_RDX,in_RCX);
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    plVar4 = (long *)(**(code **)(*in_RSI + 0x48))();
    peVar3 = (error_category *)(**(code **)(*plVar4 + 0x10))();
    plVar4 = (long *)(**(code **)(*in_RSI + 0x48))();
    this = (ser_error *)(**(code **)(*plVar4 + 0x18))();
    ec_00._M_cat = peVar3;
    ec_00._0_8_ = plVar4;
    ser_error::ser_error(this,ec_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  bVar1 = json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          ::is_valid(in_RDX);
  if (!bVar1) {
    column = __cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>
              (in_stack_ffffffffffffff40,(conv_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    plVar4 = (long *)(**(code **)(*in_RSI + 0x48))();
    (**(code **)(*plVar4 + 0x10))();
    plVar5 = (long *)(**(code **)(*in_RSI + 0x48))();
    (**(code **)(*plVar5 + 0x18))();
    ec_01._M_cat = in_stack_ffffffffffffff70;
    ec_01._0_8_ = in_stack_ffffffffffffff68;
    ser_error::ser_error(in_stack_ffffffffffffff60,ec_01,(size_t)plVar4,column);
    __cxa_throw(column,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result(this_00);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  as<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>>
            (in_stack_ffffffffffffff38);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xc2e666);
  return (variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>
          *)in_RDI;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            decoder.reset();
            cursor.read_to(decoder, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, cursor.context().line(), cursor.context().column()));
            }
            else if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(conv_errc::conversion_failed, cursor.context().line(), cursor.context().column()));
            }
            return decoder.get_result().template as<T>();
        }